

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

void charactersDebug(void *ctx,xmlChar *ch,int len)

{
  ulong uVar1;
  char out [40];
  xmlChar local_28 [40];
  
  callbacks = callbacks + 1;
  if (noout != 0) {
    return;
  }
  for (uVar1 = 0; ((long)uVar1 < (long)len && (uVar1 < 0x1e)); uVar1 = uVar1 + 1) {
    local_28[uVar1] = ch[uVar1];
  }
  local_28[uVar1] = '\0';
  fprintf(_stdout,"SAX.characters(%s, %d)\n",local_28,len);
  return;
}

Assistant:

static void
charactersDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char out[40];
    int i;

    callbacks++;
    if (noout)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	out[i] = ch[i];
    out[i] = 0;

    fprintf(stdout, "SAX.characters(%s, %d)\n", out, len);
}